

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O3

void anon_unknown.dwarf_5496d::updateHelpers
               (TParameters *params,TClusterCount *clusterCount,TClusterPos *clusterPos,int nLetters
               ,int c0,int c1,TClusterToLetterMap *clMap,TPlainText *plainText,
               TLetterCount *letterCount,float *letterFreqCost)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer pvVar6;
  int *piVar7;
  float fVar8;
  mapped_type *pmVar9;
  undefined4 *puVar10;
  int *piVar11;
  long lVar12;
  float fVar13;
  int local_4c;
  TClusterPos *local_48;
  TParameters *local_40;
  int local_34;
  
  local_4c = c1;
  local_48 = clusterPos;
  local_40 = params;
  local_34 = c0;
  pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                     (clMap,&local_34);
  iVar1 = *pmVar9;
  pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                     (clMap,&local_4c);
  iVar2 = *pmVar9;
  piVar5 = (clusterCount->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = piVar5[local_34];
  iVar4 = piVar5[local_4c];
  piVar5 = (letterCount->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar11 = piVar5 + iVar1;
  *piVar11 = *piVar11 + (iVar4 - iVar3);
  piVar11 = piVar5 + iVar2;
  *piVar11 = *piVar11 + (iVar3 - iVar4);
  pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                     (clMap,&local_34);
  *pmVar9 = iVar2;
  pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                     (clMap,&local_4c);
  *pmVar9 = iVar1;
  pvVar6 = (local_48->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  piVar11 = pvVar6[local_34].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar7 = *(pointer *)
            ((long)&pvVar6[local_34].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (piVar11 != piVar7) {
    piVar5 = (plainText->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      piVar5[*piVar11] = iVar2;
      piVar11 = piVar11 + 1;
    } while (piVar11 != piVar7);
  }
  piVar11 = pvVar6[local_4c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar7 = *(pointer *)
            ((long)&pvVar6[local_4c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (piVar11 != piVar7) {
    piVar5 = (plainText->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      piVar5[*piVar11] = iVar1;
      piVar11 = piVar11 + 1;
    } while (piVar11 != piVar7);
  }
  puVar10 = &(anonymous_namespace)::kEnglishLetterFreq;
  if (local_40->includeSpaces != false) {
    puVar10 = &(anonymous_namespace)::kEnglishLetterWithSpacesFreq;
  }
  fVar13 = 0.0;
  lVar12 = 0;
  do {
    fVar8 = (float)puVar10[lVar12] * 0.01 -
            (float)(letterCount->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar12] / (float)nLetters;
    fVar13 = fVar13 + fVar8 * fVar8;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x1b);
  fVar13 = fVar13 / 27.0;
  if (fVar13 < 0.0) {
    fVar13 = sqrtf(fVar13);
  }
  else {
    fVar13 = SQRT(fVar13);
  }
  *letterFreqCost = fVar13;
  return;
}

Assistant:

void updateHelpers(
        const Cipher::TParameters & params,
        const Cipher::TClusterCount & clusterCount,
        const Cipher::TClusterPos & clusterPos,
        const int nLetters,
        int c0, int c1,
        TClusterToLetterMap & clMap,
        Cipher::TPlainText & plainText,
        Cipher::TLetterCount & letterCount,
        float & letterFreqCost) {

    int p0 = clMap.at(c0);
    int p1 = clMap.at(c1);

    int nc0 = clusterCount[c0];
    int nc1 = clusterCount[c1];

    letterCount[p0] += nc1 - nc0;
    letterCount[p1] += nc0 - nc1;

    clMap.at(c0) = p1;
    clMap.at(c1) = p0;

    for (auto & i : clusterPos[c0]) plainText[i] = p1;
    for (auto & i : clusterPos[c1]) plainText[i] = p0;

    letterFreqCost = 0.0;
    {
        auto & freq = params.includeSpaces ? kEnglishLetterWithSpacesFreq : kEnglishLetterFreq;
        for (int i = 0; i < 27; ++i) {
            float curf = 0.01*freq[i] - ((float)(letterCount[i]))/((float)(nLetters));
            letterFreqCost += curf*curf;
        }
    }

    letterFreqCost /= 27.0;
    letterFreqCost = sqrt(letterFreqCost);
}